

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::parseArrayTypeSuffixes
          (StructuralParser *this,Expression *t,ParseTypeContext parseContext)

{
  bool bVar1;
  TypeMetaFunction *pTVar2;
  CompileMessage local_58;
  
  while (bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2cada8), bVar1)
  {
    t = parseSubscriptWithBrackets(this,t);
  }
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x2c85e0);
  if (bVar1) {
    switch(parseContext) {
    case variableType:
      Errors::typeCannotBeReference<>();
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
      break;
    case nameOrType:
    case metaFunctionArgument:
      goto switchD_0022de90_caseD_1;
    default:
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::skip(&this->super_SOULTokeniser);
      local_58.description._M_dataplus._M_p._0_4_ = 3;
      pTVar2 = allocate<soul::AST::TypeMetaFunction,soul::AST::Context&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op>
                         (this,&(t->super_Statement).super_ASTObject.context,t,(Op *)&local_58);
      return &pTVar2->super_Expression;
    case eventType:
      Errors::eventTypeCannotBeReference<>();
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
      break;
    case structMember:
      Errors::memberCannotBeReference<>();
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
      break;
    case usingDeclTarget:
      Errors::usingCannotBeReference<>();
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
      break;
    case processorParameter:
      Errors::processorParamsCannotBeReference<>();
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_58);
    }
    CompileMessage::~CompileMessage(&local_58);
  }
switchD_0022de90_caseD_1:
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x29da52);
  if (bVar1) {
    t = parseDotOperator(this,t);
  }
  return t;
}

Assistant:

AST::Expression& parseArrayTypeSuffixes (AST::Expression& t, ParseTypeContext parseContext)
    {
        if (matchIf (Operator::openBracket))
            return parseArrayTypeSuffixes (parseSubscriptWithBrackets (t), parseContext);

        if (matches (Operator::bitwiseAnd))
        {
            switch (parseContext)
            {
                case ParseTypeContext::variableType:         throwError (Errors::typeCannotBeReference()); break;
                case ParseTypeContext::eventType:            throwError (Errors::eventTypeCannotBeReference()); break;
                case ParseTypeContext::structMember:         throwError (Errors::memberCannotBeReference()); break;
                case ParseTypeContext::usingDeclTarget:      throwError (Errors::usingCannotBeReference()); break;
                case ParseTypeContext::processorParameter:   throwError (Errors::processorParamsCannotBeReference()); break;
                case ParseTypeContext::metaFunctionArgument: break;
                case ParseTypeContext::nameOrType:           break;

                default:
                    skip();
                    return allocate<AST::TypeMetaFunction> (t.context, t, AST::TypeMetaFunction::Op::makeReference);
            }
        }

        if (matches (Operator::dot))
            return parseDotOperator (t);

        return t;
    }